

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

int __thiscall ModelWriter::fprintf_param_int_array(ModelWriter *this,int id,Mat *m,FILE *pp)

{
  uint uVar1;
  int *piVar2;
  FILE *in_RCX;
  Mat *in_RDX;
  int in_ESI;
  int i;
  int *ptr;
  int count;
  int local_34;
  
  uVar1 = in_RDX->w;
  piVar2 = ncnn::Mat::operator_cast_to_int_(in_RDX);
  fprintf(in_RCX," -%d=%d",(ulong)(in_ESI + 0x5b04),(ulong)uVar1);
  for (local_34 = 0; local_34 < (int)uVar1; local_34 = local_34 + 1) {
    fprintf(in_RCX,",%d",(ulong)(uint)piVar2[local_34]);
  }
  return 0;
}

Assistant:

int ModelWriter::fprintf_param_int_array(int id, const ncnn::Mat& m, FILE* pp)
{
    const int count = m.w;
    const int* ptr = m;

    fprintf(pp, " -%d=%d", 23300 + id, count);
    for (int i = 0; i < count; i++)
    {
        fprintf(pp, ",%d", ptr[i]);
    }

    return 0;
}